

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O2

void nhdp_domain_store_willingness(nhdp_link *lnk)

{
  uint8_t uVar1;
  list_entity *plVar2;
  
  uVar1 = _flooding_domain._tmp_willingness;
  lnk->flooding_willingness = _flooding_domain._tmp_willingness;
  if (((&log_global_mask)[LOG_NHDP_R] & 1) != 0) {
    oonf_log(1,(ulong)LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2ea,0,0,
             "Set flooding willingness: %u",uVar1);
  }
  plVar2 = &_domain_list;
  while (plVar2 = plVar2->next, plVar2->prev != _domain_list.prev) {
    uVar1 = *(uint8_t *)((long)&plVar2[-0x27].prev + 1);
    lnk->neigh->_domaindata[*(int *)((long)&plVar2[-0x27].next + 4)].willingness = uVar1;
    if (((&log_global_mask)[LOG_NHDP_R] & 1) != 0) {
      oonf_log(1,(ulong)LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2ef,0,0,
               "Set routing willingness for domain %u: %u",
               *(undefined1 *)((long)&plVar2[-0x27].next + 1),uVar1);
    }
  }
  return;
}

Assistant:

void
nhdp_domain_store_willingness(struct nhdp_link *lnk) {
  struct nhdp_neighbor_domaindata *neighdata;
  struct nhdp_domain *domain;

  lnk->flooding_willingness = _flooding_domain._tmp_willingness;
  OONF_DEBUG(LOG_NHDP_R, "Set flooding willingness: %u", lnk->flooding_willingness);

  list_for_each_element(&_domain_list, domain, _node) {
    neighdata = nhdp_domain_get_neighbordata(domain, lnk->neigh);
    neighdata->willingness = domain->_tmp_willingness;
    OONF_DEBUG(LOG_NHDP_R, "Set routing willingness for domain %u: %u", domain->ext, neighdata->willingness);
  }
}